

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

cmCommandName * __thiscall
cmCommandContext::cmCommandName::operator=(cmCommandName *this,string *name)

{
  string sStack_38;
  
  std::__cxx11::string::_M_assign((string *)&this->Original);
  cmsys::SystemTools::LowerCase(&sStack_38,name);
  std::__cxx11::string::operator=((string *)this,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return this;
}

Assistant:

cmCommandContext::cmCommandName& cmCommandContext::cmCommandName::operator=(
  std::string const& name)
{
  this->Original = name;
  this->Lower = cmSystemTools::LowerCase(name);
  return *this;
}